

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O3

SHWBufferLink * __thiscall
irr::video::COpenGLDriver::createHardwareBuffer(COpenGLDriver *this,IMeshBuffer *mb)

{
  size_t *psVar1;
  _func_int **pp_Var2;
  int iVar3;
  u32 uVar4;
  E_HARDWARE_MAPPING EVar5;
  SHWBufferLink *pSVar6;
  _List_node_base *p_Var7;
  
  if ((mb != (IMeshBuffer *)0x0) &&
     ((iVar3 = (*mb->_vptr_IMeshBuffer[0x15])(mb), iVar3 != 0 ||
      (iVar3 = (*mb->_vptr_IMeshBuffer[0x14])(mb), iVar3 != 0)))) {
    pSVar6 = (SHWBufferLink *)operator_new(0x38);
    pSVar6->_vptr_SHWBufferLink = (_func_int **)&PTR__SHWBufferLink_00264f98;
    pSVar6->MeshBuffer = mb;
    pSVar6->ChangedID_Vertex = 0;
    pSVar6->ChangedID_Index = 0;
    pSVar6->Mapped_Vertex = EHM_NEVER;
    pSVar6->Mapped_Index = EHM_NEVER;
    (pSVar6->listPosition)._M_node = (_List_node_base *)0x0;
    pp_Var2 = mb->_vptr_IMeshBuffer;
    *(int *)(&mb->field_0x10 + (long)pp_Var2[-3]) =
         *(int *)(&mb->field_0x10 + (long)pp_Var2[-3]) + 1;
    (*pp_Var2[0x1a])(mb,pSVar6);
    pSVar6->_vptr_SHWBufferLink = (_func_int **)&PTR__SHWBufferLink_00264f50;
    pSVar6[1]._vptr_SHWBufferLink = (_func_int **)0x0;
    p_Var7 = (_List_node_base *)operator_new(0x18);
    p_Var7[1]._M_next = (_List_node_base *)pSVar6;
    ::std::__detail::_List_node_base::_M_hook(p_Var7);
    psVar1 = &(this->super_CNullDriver).HWBufferList.
              super__List_base<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    (pSVar6->listPosition)._M_node = (_List_node_base *)p_Var7;
    uVar4 = (*(code *)((_List_node_base *)pSVar6->MeshBuffer)->_M_next[0xc]._M_next)();
    pSVar6->ChangedID_Vertex = uVar4;
    uVar4 = (*(code *)((_List_node_base *)pSVar6->MeshBuffer)->_M_next[0xc]._M_prev)();
    pSVar6->ChangedID_Index = uVar4;
    EVar5 = (*mb->_vptr_IMeshBuffer[0x14])(mb);
    pSVar6->Mapped_Vertex = EVar5;
    EVar5 = (*mb->_vptr_IMeshBuffer[0x15])(mb);
    pSVar6->Mapped_Index = EVar5;
    pSVar6[1]._vptr_SHWBufferLink = (_func_int **)0x0;
    pSVar6[1].MeshBuffer = (IMeshBuffer *)0x0;
    iVar3 = (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x6b])(this,pSVar6);
    if ((char)iVar3 != '\0') {
      return pSVar6;
    }
    (*(this->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x6d])(this,pSVar6);
  }
  return (SHWBufferLink *)0x0;
}

Assistant:

COpenGLDriver::SHWBufferLink *COpenGLDriver::createHardwareBuffer(const scene::IMeshBuffer *mb)
{
#if defined(GL_ARB_vertex_buffer_object)
	if (!mb || (mb->getHardwareMappingHint_Index() == scene::EHM_NEVER && mb->getHardwareMappingHint_Vertex() == scene::EHM_NEVER))
		return 0;

	SHWBufferLink_opengl *HWBuffer = new SHWBufferLink_opengl(mb);

	// add to map
	HWBuffer->listPosition = HWBufferList.insert(HWBufferList.end(), HWBuffer);

	HWBuffer->ChangedID_Vertex = HWBuffer->MeshBuffer->getChangedID_Vertex();
	HWBuffer->ChangedID_Index = HWBuffer->MeshBuffer->getChangedID_Index();
	HWBuffer->Mapped_Vertex = mb->getHardwareMappingHint_Vertex();
	HWBuffer->Mapped_Index = mb->getHardwareMappingHint_Index();
	HWBuffer->vbo_verticesID = 0;
	HWBuffer->vbo_indicesID = 0;
	HWBuffer->vbo_verticesSize = 0;
	HWBuffer->vbo_indicesSize = 0;

	if (!updateHardwareBuffer(HWBuffer)) {
		deleteHardwareBuffer(HWBuffer);
		return 0;
	}

	return HWBuffer;
#else
	return 0;
#endif
}